

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  bool bVar174;
  bool bVar175;
  uint uVar176;
  int iVar177;
  ulong uVar178;
  secp256k1_sha256 *psVar179;
  secp256k1_sha256 *psVar180;
  byte bVar181;
  int iVar182;
  long lVar183;
  ulong uVar184;
  ulong uVar185;
  ulong uVar186;
  secp256k1_sha256 *psVar187;
  ulong uVar188;
  secp256k1_sha256 *psVar189;
  secp256k1_sha256 *psVar190;
  int iVar191;
  secp256k1_sha256 *psVar192;
  secp256k1_sha256 *psVar193;
  secp256k1_sha256 *psVar194;
  ulong uVar195;
  uint32_t *puVar196;
  secp256k1_sha256 *psVar197;
  uint32_t *puVar198;
  secp256k1_sha256 *psVar199;
  int iVar200;
  secp256k1_sha256 *psVar201;
  secp256k1_sha256 *unaff_R12;
  ulong unaff_R13;
  secp256k1_sha256 *a;
  secp256k1_sha256 *psVar202;
  ulong uVar203;
  secp256k1_sha256 *psVar204;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  uchar auStack_3b0 [40];
  secp256k1_sha256 *psStack_388;
  secp256k1_sha256 *psStack_380;
  ulong uStack_378;
  secp256k1_sha256 *psStack_370;
  secp256k1_sha256 *psStack_368;
  secp256k1_sha256 *psStack_360;
  secp256k1_sha256 *psStack_350;
  ulong uStack_348;
  ulong uStack_340;
  ulong uStack_338;
  secp256k1_fe sStack_330;
  secp256k1_sha256 *psStack_300;
  secp256k1_sha256 *psStack_2f8;
  ulong uStack_2f0;
  secp256k1_sha256 *psStack_2e8;
  secp256k1_sha256 *psStack_2e0;
  secp256k1_sha256 *psStack_2d8;
  undefined8 uStack_2c8;
  undefined1 auStack_2c0 [32];
  long lStack_2a0;
  secp256k1_sha256 *psStack_298;
  ulong uStack_290;
  secp256k1_sha256 *psStack_288;
  undefined1 auStack_280 [40];
  secp256k1_modinv64_trans2x2 sStack_258;
  secp256k1_sha256 *psStack_238;
  secp256k1_sha256 *psStack_230;
  ulong uStack_228;
  secp256k1_sha256 *psStack_220;
  secp256k1_sha256 *psStack_218;
  secp256k1_sha256 *psStack_210;
  undefined1 auStack_208 [56];
  ulong uStack_1d0;
  ulong uStack_1c8;
  ulong uStack_1c0;
  ulong uStack_1b8;
  undefined4 auStack_1b0 [2];
  secp256k1_modinv64_signed62 sStack_1a8;
  secp256k1_fe sStack_180;
  secp256k1_sha256 *psStack_150;
  secp256k1_sha256 *psStack_148;
  ulong uStack_138;
  secp256k1_sha256 *psStack_130;
  ulong uStack_128;
  secp256k1_sha256 *psStack_120;
  ulong uStack_118;
  secp256k1_sha256 *psStack_110;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  secp256k1_fe sStack_f0;
  uchar *puStack_b8;
  uint32_t local_84;
  secp256k1_sha256 local_80;
  
  psVar187 = &local_80;
  psVar189 = psVar187;
  for (lVar183 = 0xd; lVar183 != 0; lVar183 = lVar183 + -1) {
    *(undefined8 *)psVar189->s = *(undefined8 *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar189 = (secp256k1_sha256 *)(psVar189->s + 2);
  }
  uVar203 = local_80.bytes >> 6;
  local_84 = cnt;
  secp256k1_sha256_write(psVar187,(uchar *)&local_84,4);
  psVar189 = (secp256k1_sha256 *)out32;
  secp256k1_sha256_finalize(psVar187,out32);
  if (local_80.bytes >> 6 == uVar203 + 1) {
    return;
  }
  secp256k1_ellswift_prng_cold_1();
  a = (secp256k1_sha256 *)0xfffffffffffff;
  psVar204 = (secp256k1_sha256 *)0x1000003d0;
  psStack_148 = (secp256k1_sha256 *)0x152a36;
  puStack_b8 = out32;
  secp256k1_fe_verify((secp256k1_fe *)psVar189);
  uVar203 = (*(ulong *)psVar189->buf >> 0x30) * 0x1000003d1 + *(long *)psVar189->s;
  if (((uVar203 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar203 & 0xfffffffffffff) == 0)) {
    uVar184 = (uVar203 >> 0x34) + *(long *)(psVar189->s + 2);
    psVar192 = (secp256k1_sha256 *)((uVar184 >> 0x34) + *(long *)(psVar189->s + 4));
    psVar193 = (secp256k1_sha256 *)(((ulong)psVar192 >> 0x34) + *(long *)(psVar189->s + 6));
    uVar195 = ((ulong)psVar193 >> 0x34) + (*(ulong *)psVar189->buf & 0xffffffffffff);
    if ((((uVar184 | uVar203 | (ulong)psVar192 | (ulong)psVar193) & 0xfffffffffffff) == 0 &&
         uVar195 == 0) ||
       (((uVar203 | 0x1000003d0) & uVar184 & (ulong)psVar192 & (ulong)psVar193 &
        (uVar195 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_0015330c;
  }
  psStack_148 = (secp256k1_sha256 *)0x152aec;
  psVar192 = psVar189;
  secp256k1_fe_mul(&sStack_f0,(secp256k1_fe *)psVar189,(secp256k1_fe *)psVar187);
  psStack_148 = (secp256k1_sha256 *)0x152af4;
  psVar193 = psVar187;
  secp256k1_fe_verify((secp256k1_fe *)psVar187);
  if (*(int *)(psVar187->buf + 8) < 9) {
    a = (secp256k1_sha256 *)&psStack_120;
    uVar203 = *(ulong *)psVar187->s;
    uVar184 = *(ulong *)(psVar187->s + 2);
    unaff_R12 = *(secp256k1_sha256 **)(psVar187->s + 4);
    unaff_R13 = *(ulong *)(psVar187->s + 6);
    uVar195 = *(ulong *)psVar187->buf;
    psVar204 = (secp256k1_sha256 *)0xfffffffffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar203 * 2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = unaff_R13;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar184 * 2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = unaff_R12;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar195;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar195;
    uVar178 = SUB168(auVar4 * auVar84,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    uStack_128 = uVar185 & 0xfffffffffffff;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar195 = uVar195 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar203;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar195;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar184 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = unaff_R13;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_R12;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = unaff_R12;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar178 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
    auVar2 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_138 = (uVar178 & 0xfffffffffffff) >> 0x30;
    psStack_130 = (secp256k1_sha256 *)(uVar178 & 0xffffffffffff);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar203;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar203;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar184;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar195;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (long)unaff_R12 * 2;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = unaff_R13;
    auVar2 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
    uVar178 = auVar2._0_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | uStack_138;
    auVar2 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
    uVar178 = auVar2._0_8_;
    psStack_120 = (secp256k1_sha256 *)(uVar178 & 0xfffffffffffff);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar203 * 2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar184;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R12;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar195;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_R13;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = unaff_R13;
    auVar3 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
    uVar178 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar178 >> 0x34 | auVar3._8_8_ << 0xc;
    uStack_118 = uVar185 & 0xfffffffffffff;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar203 * 2;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = unaff_R12;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar184;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar184;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = unaff_R13;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar195;
    auVar151 = auVar19 * auVar97 + auVar151;
    uVar203 = auVar151._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar203 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
    uVar184 = auVar2._0_8_;
    psStack_110 = (secp256k1_sha256 *)(uVar184 & 0xfffffffffffff);
    auVar152._8_8_ = 0;
    auVar152._0_8_ = (uVar184 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_128;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar203 >> 0x34 | auVar151._8_8_ << 0xc;
    auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
    uVar203 = auVar152._0_8_;
    uStack_108 = uVar203 & 0xfffffffffffff;
    uStack_100 = (long)psStack_130->s + (uVar203 >> 0x34 | auVar152._8_8_ << 0xc);
    uStack_f8 = 1;
    psStack_148 = (secp256k1_sha256 *)0x152d3e;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar192 = (secp256k1_sha256 *)&sStack_f0;
    psStack_148 = (secp256k1_sha256 *)0x152d4e;
    secp256k1_fe_mul((secp256k1_fe *)psVar192,(secp256k1_fe *)psVar192,(secp256k1_fe *)a);
    psStack_148 = (secp256k1_sha256 *)0x152d56;
    psVar193 = psVar189;
    secp256k1_fe_verify((secp256k1_fe *)psVar189);
    psVar187 = psVar189;
    if (8 < *(int *)(psVar189->buf + 8)) goto LAB_001532f8;
    uVar184 = *(ulong *)psVar189->s;
    uVar195 = *(ulong *)(psVar189->s + 2);
    psVar194 = *(secp256k1_sha256 **)(psVar189->s + 4);
    uVar203 = *(ulong *)(psVar189->s + 6);
    uVar178 = *(ulong *)psVar189->buf;
    psVar204 = (secp256k1_sha256 *)0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar184 * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar203;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar195 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = psVar194;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar178;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar178;
    uVar185 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar185 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar186 = auVar2._0_8_;
    uStack_128 = uVar186 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
    a = (secp256k1_sha256 *)(uVar178 * 2);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar184;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = a;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar195 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar203;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = psVar194;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = psVar194;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar185 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar2 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
             auVar29 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_138 = (uVar178 & 0xfffffffffffff) >> 0x30;
    psVar192 = (secp256k1_sha256 *)(uVar178 & 0xffffffffffff);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar184;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar184;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar195;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = a;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (long)psVar194 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar203;
    auVar2 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar178 = auVar2._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | uStack_138;
    auVar2 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar178 = auVar2._0_8_;
    psStack_120 = (secp256k1_sha256 *)(uVar178 & 0xfffffffffffff);
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar178 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar184 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar195;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = psVar194;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = a;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar203;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar203;
    auVar3 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar178 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar178 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar185 = auVar2._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar178 >> 0x34 | auVar3._8_8_ << 0xc;
    uStack_118 = uVar185 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar185 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar184 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = psVar194;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar195;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar195;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar203;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = a;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar184 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar184 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar195 = auVar2._0_8_;
    psVar187 = (secp256k1_sha256 *)(uVar184 >> 0x34 | auVar158._8_8_ << 0xc);
    psStack_110 = (secp256k1_sha256 *)(uVar195 & 0xfffffffffffff);
    auVar159._8_8_ = 0;
    auVar159._0_8_ = (uVar195 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_128;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = psVar187;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar184 = auVar159._0_8_;
    uStack_108 = uVar184 & 0xfffffffffffff;
    uStack_100 = (long)psVar192->s + (uVar184 >> 0x34 | auVar159._8_8_ << 0xc);
    uStack_f8 = 1;
    psStack_148 = (secp256k1_sha256 *)0x152f9d;
    psStack_130 = psVar192;
    secp256k1_fe_verify((secp256k1_fe *)&psStack_120);
    psStack_148 = (secp256k1_sha256 *)0x152fa5;
    psVar193 = (secp256k1_sha256 *)&psStack_120;
    secp256k1_fe_verify((secp256k1_fe *)&psStack_120);
    unaff_R13 = uStack_108;
    unaff_R12 = psStack_110;
    psVar189 = (secp256k1_sha256 *)&psStack_120;
    if (8 < (int)uStack_f8) goto LAB_001532fd;
    psVar204 = (secp256k1_sha256 *)0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = (long)psStack_120 * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_108;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uStack_118 * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = psStack_110;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_100;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_100;
    uVar203 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar203 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar184 = auVar2._0_8_;
    uStack_128 = uVar184 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar184 >> 0x34 | auVar2._8_8_ << 0xc;
    a = (secp256k1_sha256 *)(uStack_100 * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = psStack_120;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = a;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_118 * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_108;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = psStack_110;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = psStack_110;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar203 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar2 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar203 = auVar2._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar203 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_138 = (uVar203 & 0xfffffffffffff) >> 0x30;
    psVar192 = (secp256k1_sha256 *)(uVar203 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = psStack_120;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = psStack_120;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_118;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = a;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (long)psStack_110 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uStack_108;
    auVar2 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar203 = auVar2._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar203 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar203 & 0xfffffffffffff) << 4 | uStack_138;
    auVar2 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar184 = auVar2._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar184 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (long)psStack_120 * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uStack_118;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = psStack_110;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = a;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_108;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_108;
    auVar3 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar203 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar203 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar195 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar203 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar195 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = (long)psStack_120 * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = psStack_110;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_118;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_118;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_108;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = a;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar203 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar203 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar178 = auVar2._0_8_;
    psVar187 = (secp256k1_sha256 *)(uVar203 >> 0x34 | auVar165._8_8_ << 0xc);
    psStack_110 = (secp256k1_sha256 *)(uVar178 & 0xfffffffffffff);
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar178 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_128;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = psVar187;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar203 = auVar166._0_8_;
    uStack_108 = uVar203 & 0xfffffffffffff;
    uStack_100 = (long)psVar192->s + (uVar203 >> 0x34 | auVar166._8_8_ << 0xc);
    uStack_f8 = 1;
    psStack_148 = (secp256k1_sha256 *)0x1531e8;
    psStack_130 = psVar192;
    psStack_120 = (secp256k1_sha256 *)(uVar184 & 0xfffffffffffff);
    uStack_118 = uVar195 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)&psStack_120);
    psStack_148 = (secp256k1_sha256 *)0x1531f0;
    psVar193 = (secp256k1_sha256 *)&psStack_120;
    secp256k1_fe_verify((secp256k1_fe *)&psStack_120);
    if (4 < (int)uStack_f8) goto LAB_00153302;
    psVar187 = (secp256k1_sha256 *)&psStack_120;
    psVar192 = (secp256k1_sha256 *)((long)psStack_120 * 7);
    uStack_118 = uStack_118 * 7;
    psStack_110 = (secp256k1_sha256 *)((long)psStack_110 * 7);
    uStack_108 = uStack_108 * 7;
    uStack_100 = uStack_100 * 7;
    uStack_f8 = (ulong)(uint)((int)uStack_f8 * 7);
    psStack_148 = (secp256k1_sha256 *)0x15327a;
    psStack_120 = psVar192;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    a = (secp256k1_sha256 *)&sStack_f0;
    psStack_148 = (secp256k1_sha256 *)0x153287;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_148 = (secp256k1_sha256 *)0x15328f;
    psVar193 = psVar187;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    sStack_f0.magnitude = (int)uStack_f8 + sStack_f0.magnitude;
    if (sStack_f0.magnitude < 0x21) {
      sStack_f0.n[0] = (long)psStack_120->s + sStack_f0.n[0];
      sStack_f0.n[1] = sStack_f0.n[1] + uStack_118;
      sStack_f0.n[2] = (long)psStack_110->s + sStack_f0.n[2];
      sStack_f0.n[3] = sStack_f0.n[3] + uStack_108;
      sStack_f0.n[4] = sStack_f0.n[4] + uStack_100;
      sStack_f0.normalized = 0;
      psStack_148 = (secp256k1_sha256 *)0x1532d9;
      secp256k1_fe_verify(&sStack_f0);
      psStack_148 = (secp256k1_sha256 *)0x1532e1;
      secp256k1_fe_is_square_var(&sStack_f0);
      return;
    }
  }
  else {
    psStack_148 = (secp256k1_sha256 *)0x1532f8;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_001532f8:
    psStack_148 = (secp256k1_sha256 *)0x1532fd;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
    psVar194 = unaff_R12;
    uVar203 = unaff_R13;
LAB_001532fd:
    unaff_R13 = uVar203;
    unaff_R12 = psVar194;
    psStack_148 = (secp256k1_sha256 *)0x153302;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00153302:
    psStack_148 = (secp256k1_sha256 *)0x153307;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  psStack_148 = (secp256k1_sha256 *)0x15330c;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
LAB_0015330c:
  psStack_148 = (secp256k1_sha256 *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_148 = a;
  psStack_150 = psVar187;
  psVar194 = (secp256k1_sha256 *)auStack_208;
  psVar202 = (secp256k1_sha256 *)auStack_208;
  psVar187 = (secp256k1_sha256 *)auStack_208;
  auStack_208._48_8_ = *(undefined8 *)psVar193->s;
  uStack_1d0 = *(ulong *)(psVar193->s + 2);
  uStack_1c8 = *(ulong *)(psVar193->s + 4);
  uStack_1c0 = *(ulong *)(psVar193->s + 6);
  uStack_1b8 = *(ulong *)psVar193->buf;
  auStack_1b0 = *(undefined4 (*) [2])(psVar193->buf + 8);
  psStack_210 = (secp256k1_sha256 *)0x15333d;
  secp256k1_fe_verify((secp256k1_fe *)psVar193);
  auStack_208._0_8_ = *(undefined8 *)psVar193->s;
  auStack_208._8_8_ = *(undefined8 *)(psVar193->s + 2);
  auStack_208._16_8_ = *(undefined8 *)(psVar193->s + 4);
  auStack_208._24_8_ = *(undefined8 *)(psVar193->s + 6);
  auStack_208._32_8_ = *(undefined8 *)psVar193->buf;
  auStack_208._40_8_ = *(undefined8 *)(psVar193->buf + 8);
  psStack_210 = (secp256k1_sha256 *)0x15335e;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_208);
  psStack_210 = (secp256k1_sha256 *)0x153366;
  secp256k1_fe_verify((secp256k1_fe *)auStack_208);
  if (auStack_208._44_4_ == 0) {
    psStack_210 = (secp256k1_sha256 *)0x1534ff;
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_208._16_8_ == 0 && auStack_208._24_8_ == 0) &&
        (auStack_208._8_8_ == 0 && auStack_208._0_8_ == 0)) && auStack_208._32_8_ == 0) {
      psVar187 = (secp256k1_sha256 *)0x1;
    }
    else {
      sStack_1a8.v[0] = (auStack_208._8_8_ << 0x34 | auStack_208._0_8_) & 0x3fffffffffffffff;
      sStack_1a8.v[1] =
           (ulong)((uint)auStack_208._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_208._8_8_ >> 10;
      sStack_1a8.v[2] =
           (ulong)((uint)auStack_208._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_208._16_8_ >> 0x14;
      sStack_1a8.v[3] =
           (auStack_208._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_208._24_8_ >> 0x1e;
      sStack_1a8.v[4] = (ulong)auStack_208._32_8_ >> 0x28;
      psStack_210 = (secp256k1_sha256 *)0x153421;
      uVar176 = secp256k1_jacobi64_maybe_var(&sStack_1a8,&secp256k1_const_modinfo_fe);
      if (uVar176 == 0) {
        psStack_210 = (secp256k1_sha256 *)0x153445;
        uVar176 = secp256k1_fe_sqrt(&sStack_180,(secp256k1_fe *)auStack_208);
        psVar187 = (secp256k1_sha256 *)(ulong)uVar176;
      }
      else {
        psVar187 = (secp256k1_sha256 *)(ulong)(~uVar176 >> 0x1f);
      }
    }
    a = (secp256k1_sha256 *)(auStack_208 + 0x30);
    psStack_210 = (secp256k1_sha256 *)0x153454;
    secp256k1_fe_verify((secp256k1_fe *)a);
    auStack_208._48_8_ = (uStack_1b8 >> 0x30) * 0x1000003d1 + auStack_208._48_8_;
    uStack_1d0 = ((ulong)auStack_208._48_8_ >> 0x34) + uStack_1d0;
    uStack_1c8 = (uStack_1d0 >> 0x34) + uStack_1c8;
    uVar203 = (uStack_1c8 >> 0x34) + uStack_1c0;
    uStack_1c0 = uVar203 & 0xfffffffffffff;
    uStack_1b8 = (uVar203 >> 0x34) + (uStack_1b8 & 0xffffffffffff);
    uStack_1c8 = uStack_1c8 & 0xfffffffffffff;
    uStack_1d0 = uStack_1d0 & 0xfffffffffffff;
    auStack_208._48_8_ = auStack_208._48_8_ & 0xfffffffffffff;
    auStack_1b0[0] = 1;
    psStack_210 = (secp256k1_sha256 *)0x1534de;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_210 = (secp256k1_sha256 *)0x1534e9;
    psVar192 = a;
    iVar177 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_208,(secp256k1_fe *)a);
    psVar194 = psVar202;
    if ((int)psVar187 == iVar177) {
      return;
    }
  }
  psStack_210 = (secp256k1_sha256 *)secp256k1_jacobi64_maybe_var;
  secp256k1_fe_is_square_var_cold_1();
  psStack_210 = psVar189;
  psStack_218 = psVar204;
  psStack_220 = a;
  uStack_228 = unaff_R13;
  psStack_230 = unaff_R12;
  psStack_238 = psVar187;
  auStack_280._32_8_ = *(uint64_t *)psVar192->buf;
  auStack_280._16_8_ = *(undefined8 *)(psVar192->s + 4);
  auStack_280._24_8_ = *(undefined8 *)(psVar192->s + 6);
  auStack_280._0_8_ = *(ulong *)psVar192->s;
  auStack_280._8_8_ = *(long *)(psVar192->s + 2);
  auStack_2c0._0_8_ = *(undefined8 *)psVar194->s;
  auStack_2c0._8_8_ = *(undefined8 *)(psVar194->s + 2);
  auStack_2c0._16_8_ = *(undefined8 *)(psVar194->s + 4);
  auStack_2c0._24_8_ = *(undefined8 *)(psVar194->s + 6);
  lStack_2a0 = *(long *)psVar194->buf;
  if (((((long)auStack_2c0._0_8_ < 0) || ((long)auStack_2c0._8_8_ < 0)) ||
      (psVar187 = psVar192, (long)auStack_2c0._16_8_ < 0)) ||
     ((psVar194 = (secp256k1_sha256 *)auStack_2c0._24_8_, (long)auStack_2c0._24_8_ < 0 ||
      (lStack_2a0 < 0)))) {
LAB_00153987:
    psStack_2d8 = (secp256k1_sha256 *)0x15398c;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_0015398c:
    psStack_2d8 = (secp256k1_sha256 *)0x153991;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00153991:
    psStack_2d8 = (secp256k1_sha256 *)0x153996;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00153996:
    psStack_2d8 = (secp256k1_sha256 *)0x15399b;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_0015399b:
    psStack_2d8 = (secp256k1_sha256 *)0x1539a0;
    secp256k1_jacobi64_maybe_var_cold_8();
    psVar192 = psVar187;
    psVar193 = unaff_R12;
    psVar202 = a;
  }
  else {
    psVar193 = unaff_R12;
    psVar202 = a;
    if (((auStack_2c0._16_8_ != 0 ||
         (secp256k1_sha256 *)auStack_2c0._24_8_ != (secp256k1_sha256 *)0x0) ||
        (auStack_2c0._8_8_ != 0 || auStack_2c0._0_8_ != 0)) || lStack_2a0 != 0) {
      a = (secp256k1_sha256 *)0x5;
      unaff_R13 = 0xffffffffffffffff;
      uStack_290 = 0;
      psVar189 = (secp256k1_sha256 *)0x0;
      psStack_298 = psVar192;
      do {
        psVar187 = psStack_298;
        psVar194 = (secp256k1_sha256 *)(auStack_280._8_8_ << 0x3e | auStack_280._0_8_);
        puVar196 = (uint32_t *)(auStack_2c0._8_8_ << 0x3e | auStack_2c0._0_8_);
        psVar179 = (secp256k1_sha256 *)0x0;
        psVar197 = (secp256k1_sha256 *)0x0;
        psVar193 = (secp256k1_sha256 *)0x1;
        iVar177 = 0x3e;
        psVar202 = (secp256k1_sha256 *)0x1;
        puVar198 = puVar196;
        psVar201 = psVar194;
        while( true ) {
          uVar203 = -1L << ((byte)iVar177 & 0x3f) | (ulong)puVar198;
          lVar183 = 0;
          if (uVar203 != 0) {
            for (; (uVar203 >> lVar183 & 1) == 0; lVar183 = lVar183 + 1) {
            }
          }
          bVar181 = (byte)lVar183;
          psVar199 = (secp256k1_sha256 *)((ulong)puVar198 >> (bVar181 & 0x3f));
          psVar202 = (secp256k1_sha256 *)((long)psVar202 << (bVar181 & 0x3f));
          psVar179 = (secp256k1_sha256 *)((long)psVar179 << (bVar181 & 0x3f));
          unaff_R13 = unaff_R13 - lVar183;
          uVar176 = ((uint)((ulong)psVar201 >> 1) ^ (uint)((ulong)psVar201 >> 2)) & (uint)lVar183 ^
                    (uint)psVar189;
          psVar204 = (secp256k1_sha256 *)(ulong)uVar176;
          iVar177 = iVar177 - (uint)lVar183;
          psStack_288 = a;
          if (iVar177 == 0) break;
          if (((ulong)psVar201 & 1) == 0) {
            psStack_2d8 = (secp256k1_sha256 *)0x153955;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00153955:
            psStack_2d8 = (secp256k1_sha256 *)0x15395a;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_0015395a:
            psStack_2d8 = (secp256k1_sha256 *)0x15395f;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_0015395f:
            psStack_2d8 = (secp256k1_sha256 *)0x153964;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00153964;
          }
          if (((ulong)psVar199 & 1) == 0) goto LAB_00153955;
          bVar181 = 0x3e - (char)iVar177;
          psVar192 = (secp256k1_sha256 *)((long)psVar201 << (bVar181 & 0x3f));
          if ((secp256k1_sha256 *)
              ((long)psVar179 * (long)puVar196 + (long)psVar202 * (long)psVar194) != psVar192)
          goto LAB_0015395a;
          psVar192 = (secp256k1_sha256 *)
                     ((long)psVar193 * (long)puVar196 + (long)psVar197 * (long)psVar194);
          if (psVar192 != (secp256k1_sha256 *)((long)psVar199 << (bVar181 & 0x3f)))
          goto LAB_0015395f;
          iVar200 = (int)psVar201;
          iVar191 = (int)psVar199;
          if ((long)unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar182 = (int)unaff_R13 + 1;
            if (iVar177 <= iVar182) {
              iVar182 = iVar177;
            }
            if (0xffffffc1 < iVar182 - 0x3fU) {
              psVar189 = (secp256k1_sha256 *)
                         (ulong)(uVar176 ^ (uint)(((ulong)psVar199 & (ulong)psVar201) >> 1));
              psVar192 = (secp256k1_sha256 *)
                         ((ulong)(0x3fL << (-(char)iVar182 & 0x3fU)) >> (-(char)iVar182 & 0x3fU));
              uVar176 = (iVar191 * iVar191 + 0x3e) * iVar191 * iVar200 & (uint)psVar192;
              psVar180 = psVar179;
              psVar179 = psVar193;
              psVar190 = psVar199;
              psVar193 = psVar202;
              psVar202 = psVar197;
              goto LAB_0015373f;
            }
            goto LAB_0015396e;
          }
          iVar182 = (int)unaff_R13 + 1;
          if (iVar177 <= iVar182) {
            iVar182 = iVar177;
          }
          if (iVar182 - 0x3fU < 0xffffffc2) goto LAB_00153969;
          psVar192 = (secp256k1_sha256 *)
                     ((ulong)(0xfL << (-(char)iVar182 & 0x3fU)) >> (-(char)iVar182 & 0x3fU));
          uVar176 = -(iVar191 * ((iVar200 * 2 + 2U & 8) + iVar200)) & (uint)psVar192;
          psVar180 = psVar193;
          psVar190 = psVar201;
          psVar193 = psVar197;
          psVar201 = psVar199;
          psVar189 = psVar204;
LAB_0015373f:
          uVar203 = (ulong)uVar176;
          puVar198 = (uint32_t *)((long)psVar201->s + uVar203 * (long)psVar190);
          psVar197 = (secp256k1_sha256 *)((long)psVar193->s + (long)psVar202 * uVar203);
          psVar193 = (secp256k1_sha256 *)((long)psVar180->s + uVar203 * (long)psVar179);
          psVar201 = psVar190;
          psVar204 = psVar189;
          if (((ulong)puVar198 & (ulong)psVar192) != 0) {
LAB_00153964:
            psStack_2d8 = (secp256k1_sha256 *)0x153969;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00153969:
            psStack_2d8 = (secp256k1_sha256 *)0x15396e;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_0015396e:
            psStack_2d8 = (secp256k1_sha256 *)0x153973;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar187 = psVar192;
            unaff_R12 = psVar193;
            a = psVar202;
            goto LAB_00153973;
          }
        }
        psVar194 = SUB168(SEXT816((long)psVar179) * SEXT816((long)psVar197),8);
        lVar183 = (long)psVar202 * (long)psVar193 - (long)psVar179 * (long)psVar197;
        uVar203 = (ulong)((ulong)((long)psVar202 * (long)psVar193) <
                         (ulong)((long)psVar179 * (long)psVar197));
        uVar184 = SUB168(SEXT816((long)psVar202) * SEXT816((long)psVar193),8) - (long)psVar194;
        psVar189 = (secp256k1_sha256 *)auStack_2c0;
        sStack_258.u = (int64_t)psVar202;
        sStack_258.v = (int64_t)psVar179;
        sStack_258.q = (int64_t)psVar197;
        sStack_258.r = (int64_t)psVar193;
        if ((uVar184 - uVar203 != -1 || lVar183 != -0x4000000000000000) &&
           (lVar183 != 0x4000000000000000 || uVar184 != uVar203)) goto LAB_001539a5;
        unaff_R12 = (secp256k1_sha256 *)auStack_280;
        iVar191 = (int)a;
        psStack_2d8 = (secp256k1_sha256 *)0x1537ed;
        psVar194 = unaff_R12;
        iVar177 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar191,
                             (secp256k1_modinv64_signed62 *)psStack_298,0);
        if (iVar177 < 1) {
LAB_00153973:
          psStack_2d8 = (secp256k1_sha256 *)0x153978;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00153978:
          psStack_2d8 = (secp256k1_sha256 *)0x15397d;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_0015397d:
          psStack_2d8 = (secp256k1_sha256 *)0x153982;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00153982:
          psStack_2d8 = (secp256k1_sha256 *)0x153987;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00153987;
        }
        psStack_2d8 = (secp256k1_sha256 *)0x153808;
        psVar194 = unaff_R12;
        iVar177 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar191,
                             (secp256k1_modinv64_signed62 *)psVar187,1);
        if (0 < iVar177) goto LAB_00153978;
        psStack_2d8 = (secp256k1_sha256 *)0x153820;
        psVar194 = psVar189;
        iVar177 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar189,iVar191,
                             (secp256k1_modinv64_signed62 *)psVar187,0);
        if (iVar177 < 1) goto LAB_0015397d;
        psStack_2d8 = (secp256k1_sha256 *)0x15383b;
        psVar194 = psVar189;
        iVar177 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar189,iVar191,
                             (secp256k1_modinv64_signed62 *)psVar187,1);
        if (-1 < iVar177) goto LAB_00153982;
        psStack_2d8 = (secp256k1_sha256 *)0x153856;
        secp256k1_modinv64_update_fg_62_var
                  (iVar191,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)psVar189,&sStack_258);
        if (auStack_280._0_8_ == 1) {
          if (1 < iVar191) {
            psVar192 = (secp256k1_sha256 *)0x1;
            uVar203 = 0;
            do {
              uVar203 = uVar203 | *(ulong *)(auStack_280 + (long)psVar192 * 8);
              psVar192 = (secp256k1_sha256 *)((long)psVar192->s + 1);
            } while (a != psVar192);
            if (uVar203 != 0) goto LAB_00153888;
          }
          uStack_2c8._4_4_ = 1 - (uVar176 * 2 & 2);
          bVar1 = false;
        }
        else {
LAB_00153888:
          lVar183 = (long)iVar191;
          if ((-1 < lVar183 + -2 && (&psStack_288)[lVar183] == (secp256k1_sha256 *)0x0) &&
              (&uStack_2c8)[lVar183] == 0) {
            a = (secp256k1_sha256 *)(ulong)(iVar191 - 1);
          }
          psStack_2d8 = (secp256k1_sha256 *)0x1538b5;
          iVar191 = (int)a;
          psVar194 = unaff_R12;
          iVar177 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)unaff_R12,iVar191,
                               (secp256k1_modinv64_signed62 *)psVar187,0);
          if (iVar177 < 1) goto LAB_0015398c;
          psStack_2d8 = (secp256k1_sha256 *)0x1538d0;
          psVar194 = unaff_R12;
          iVar177 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)unaff_R12,iVar191,
                               (secp256k1_modinv64_signed62 *)psVar187,1);
          if (0 < iVar177) goto LAB_00153991;
          psStack_2d8 = (secp256k1_sha256 *)0x1538e8;
          psVar194 = psVar189;
          iVar177 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar189,iVar191,
                               (secp256k1_modinv64_signed62 *)psVar187,0);
          if (iVar177 < 1) goto LAB_00153996;
          psStack_2d8 = (secp256k1_sha256 *)0x153903;
          psVar194 = psVar189;
          iVar177 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar189,iVar191,
                               (secp256k1_modinv64_signed62 *)psVar187,1);
          bVar1 = true;
          if (-1 < iVar177) goto LAB_0015399b;
        }
        if ((!bVar1) ||
           (uVar176 = (int)uStack_290 + 1, uStack_290 = (ulong)uVar176, psVar192 = psVar187,
           psVar189 = psVar204, uVar176 == 0xc)) {
          return;
        }
      } while( true );
    }
  }
  psStack_2d8 = (secp256k1_sha256 *)0x1539a5;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_001539a5:
  psStack_2d8 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_360 = (secp256k1_sha256 *)0x1539c0;
  psVar187 = psVar194;
  psStack_300 = psVar192;
  psStack_2f8 = psVar193;
  uStack_2f0 = unaff_R13;
  psStack_2e8 = psVar202;
  psStack_2e0 = psVar204;
  psStack_2d8 = psVar189;
  secp256k1_fe_verify((secp256k1_fe *)psVar194);
  if (8 < *(int *)(psVar194->buf + 8)) {
    psStack_360 = (secp256k1_sha256 *)random_fe_test;
    secp256k1_ge_x_on_curve_var_cold_1();
    psStack_388 = psVar194;
    psStack_380 = psVar193;
    uStack_378 = unaff_R13;
    psStack_370 = psVar202;
    psStack_368 = psVar204;
    psStack_360 = psVar189;
    do {
      secp256k1_testrand_bytes_test(auStack_3b0,0x20);
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar187,auStack_3b0);
      bVar174 = (*(ulong *)(psVar187->s + 4) & *(ulong *)(psVar187->s + 6) &
                *(ulong *)(psVar187->s + 2)) == 0xfffffffffffff;
      bVar175 = *(long *)psVar187->buf == 0xffffffffffff;
      bVar1 = 0xffffefffffc2e < *(ulong *)psVar187->s;
      if (bVar1 && (bVar174 && bVar175)) {
        psVar187->buf[8] = 0xff;
        psVar187->buf[9] = 0xff;
        psVar187->buf[10] = 0xff;
        psVar187->buf[0xb] = 0xff;
      }
      else {
        psVar187->buf[8] = '\x01';
        psVar187->buf[9] = '\0';
        psVar187->buf[10] = '\0';
        psVar187->buf[0xb] = '\0';
        psVar187->buf[0xc] = '\x01';
        psVar187->buf[0xd] = '\0';
        psVar187->buf[0xe] = '\0';
        psVar187->buf[0xf] = '\0';
        secp256k1_fe_verify((secp256k1_fe *)psVar187);
      }
    } while (bVar1 && (bVar174 && bVar175));
    return;
  }
  uVar203 = *(ulong *)psVar194->s;
  uVar184 = *(ulong *)(psVar194->s + 2);
  uVar195 = *(ulong *)(psVar194->s + 4);
  uVar178 = *(ulong *)(psVar194->s + 6);
  uVar185 = *(ulong *)psVar194->buf;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar203 * 2;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar178;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar184 * 2;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar195;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar185;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar185;
  uVar186 = SUB168(auVar64 * auVar132,0);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar186 & 0xfffffffffffff;
  auVar2 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
  uVar188 = auVar2._0_8_;
  uStack_338 = uVar188 & 0xfffffffffffff;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar188 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar185 = uVar185 * 2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar203;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar185;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar184 * 2;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar178;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar195;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar195;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar186 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
  auVar2 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
           auVar69 * ZEXT816(0x1000003d10);
  uStack_340 = auVar2._0_8_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uStack_340 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_348 = (uStack_340 & 0xfffffffffffff) >> 0x30;
  uStack_340 = uStack_340 & 0xffffffffffff;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar203;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar203;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar184;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar185;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar195 * 2;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar178;
  auVar2 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
  uVar186 = auVar2._0_8_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = (uVar186 & 0xfffffffffffff) << 4 | uStack_348;
  auVar2 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
  uVar186 = auVar2._0_8_;
  sStack_330.n[0] = uVar186 & 0xfffffffffffff;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar186 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar203 * 2;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar184;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar195;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar185;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar178;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar178;
  auVar3 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
  uVar186 = auVar3._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar186 & 0xfffffffffffff;
  auVar2 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
  uVar188 = auVar2._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar186 >> 0x34 | auVar3._8_8_ << 0xc;
  sStack_330.n[1] = uVar188 & 0xfffffffffffff;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar188 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar203 * 2;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar195;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar184;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar184;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar178;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar185;
  auVar172 = auVar79 * auVar145 + auVar172;
  uVar203 = auVar172._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar203 & 0xfffffffffffff;
  auVar2 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
  uVar184 = auVar2._0_8_;
  sStack_330.n[2] = uVar184 & 0xfffffffffffff;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = (uVar184 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_338;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar203 >> 0x34 | auVar172._8_8_ << 0xc;
  auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
  uVar203 = auVar173._0_8_;
  sStack_330.n[3] = uVar203 & 0xfffffffffffff;
  sStack_330.n[4] = (uVar203 >> 0x34 | auVar173._8_8_ << 0xc) + uStack_340;
  sStack_330.magnitude = 1;
  sStack_330.normalized = 0;
  psStack_360 = (secp256k1_sha256 *)0x153c0c;
  psStack_350 = psVar194;
  secp256k1_fe_verify(&sStack_330);
  psStack_360 = (secp256k1_sha256 *)0x153c1c;
  secp256k1_fe_mul(&sStack_330,&sStack_330,(secp256k1_fe *)psStack_350);
  psStack_360 = (secp256k1_sha256 *)0x153c24;
  secp256k1_fe_verify(&sStack_330);
  sStack_330.n[0] = sStack_330.n[0] + 7;
  sStack_330.normalized = 0;
  sStack_330.magnitude = sStack_330.magnitude + 1;
  psStack_360 = (secp256k1_sha256 *)0x153c3b;
  secp256k1_fe_verify(&sStack_330);
  psStack_360 = (secp256k1_sha256 *)0x153c43;
  secp256k1_fe_is_square_var(&sStack_330);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);
#ifdef VERIFY
    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
#endif
}